

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckGlErrors.h
# Opt level: O0

bool GlLogCall(char *functionCall,char *file,int lineNo)

{
  uint uVar1;
  ostream *poVar2;
  void *pvVar3;
  GLenum error;
  int lineNo_local;
  char *file_local;
  char *functionCall_local;
  
  uVar1 = glGetError();
  if (uVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[OpenGL Error] (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::hex);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,uVar1);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::dec);
    poVar2 = std::operator<<(poVar2,") ");
    poVar2 = std::operator<<(poVar2,functionCall);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,file);
    poVar2 = std::operator<<(poVar2,": ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,lineNo);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  functionCall_local._7_1_ = uVar1 == 0;
  return functionCall_local._7_1_;
}

Assistant:

static bool GlLogCall(const char *functionCall, const char *file, int lineNo)
{
    GLenum error = glGetError();
    if (error == GL_NO_ERROR)
        return true;

    std::cout << "[OpenGL Error] ("
              << std::hex
              << error
              << std::dec << ") "
              << functionCall << " "
              << file << ": " << lineNo << std::endl;
    return false;
}